

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::ValueColor(char *prefix,ImU32 v)

{
  undefined1 local_24 [8];
  ImVec4 col;
  ImU32 v_local;
  char *prefix_local;
  
  col.z = (float)v;
  unique0x1000007c = prefix;
  Text("%s: %08X",prefix,(ulong)v);
  SameLine(0.0,-1.0);
  ImVec4::ImVec4((ImVec4 *)local_24);
  local_24._0_4_ = (float)((uint)col.z & 0xff) / 255.0;
  local_24._4_4_ = (float)((uint)col.z >> 8 & 0xff) / 255.0;
  col.x = (float)((uint)col.z >> 0x10 & 0xff) / 255.0;
  col.y = (float)((uint)col.z >> 0x18) / 255.0;
  ColorButton((ImVec4 *)local_24,true,true);
  return;
}

Assistant:

void ImGui::ValueColor(const char* prefix, ImU32 v)
{
    Text("%s: %08X", prefix, v);
    SameLine();

    ImVec4 col;
    col.x = (float)((v >> 0) & 0xFF) / 255.0f;
    col.y = (float)((v >> 8) & 0xFF) / 255.0f;
    col.z = (float)((v >> 16) & 0xFF) / 255.0f;
    col.w = (float)((v >> 24) & 0xFF) / 255.0f;
    ColorButton(col, true);
}